

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::ActivationLayer::outputInplace(ActivationLayer *this,Array *inputs)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t sVar3;
  Activation *pAVar4;
  float *pfVar5;
  float *pfVar6;
  size_t sVar7;
  float *pfVar8;
  float extraout_XMM0_Da;
  
  peVar1 = (this->super_ABackpropLayer).shared.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar7 = this->nSize;
  if (peVar1->_M_size != sVar7) {
    operator_delete(peVar1->_M_data);
    peVar1->_M_size = sVar7;
    pfVar5 = (float *)operator_new(sVar7 * 4);
    peVar1->_M_data = pfVar5;
    if (sVar7 != 0) {
      memset(pfVar5,0,sVar7 * 4);
    }
  }
  peVar2 = (this->super_ABackpropLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar3 = peVar2->_M_size;
  sVar7 = inputs->_M_size;
  if (sVar3 == sVar7) {
    if (sVar3 == 0) goto LAB_0011d8ea;
    pfVar5 = peVar2->_M_data;
    pfVar6 = inputs->_M_data;
  }
  else {
    if (peVar2->_M_data != (float *)0x0) {
      operator_delete(peVar2->_M_data);
      sVar7 = inputs->_M_size;
    }
    peVar2->_M_size = sVar7;
    pfVar5 = (float *)operator_new(sVar7 << 2);
    peVar2->_M_data = pfVar5;
    pfVar6 = inputs->_M_data;
    if (pfVar6 == (float *)0x0) goto LAB_0011d8ea;
    sVar3 = peVar2->_M_size;
  }
  memcpy(pfVar5,pfVar6,sVar3 << 2);
LAB_0011d8ea:
  pfVar6 = inputs->_M_data;
  pfVar5 = pfVar6 + inputs->_M_size;
  if (inputs->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  if (pfVar6 != pfVar5) {
    pfVar8 = (float *)peVar1->_M_size;
    if (pfVar8 != (float *)0x0) {
      pfVar8 = peVar1->_M_data;
    }
    pAVar4 = this->activationFunction;
    do {
      (*pAVar4->_vptr_Activation[1])(*pfVar6,pAVar4);
      *pfVar8 = extraout_XMM0_Da;
      pfVar6 = pfVar6 + 1;
      pfVar8 = pfVar8 + 1;
    } while (pfVar6 != pfVar5);
  }
  return;
}

Assistant:

virtual void outputInplace(const Array &inputs) {
        Array &outputs = *shared.outputBuffer;
        if (outputs.size() != nSize) {
            outputs.resize(nSize);
        }
        *shared.inputBuffer = inputs;
        auto &activation = (*activationFunction);
        std::transform(
            std::begin(inputs), std::end(inputs),
            std::begin(outputs),
            [&](float y) { return activation(y); });
    }